

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O3

void save_engravings(memfile *mf,level *lev)

{
  xchar xVar1;
  engr *peVar2;
  
  mfmagic_set(mf,0x52474e45);
  peVar2 = lev->lev_engr;
  if (peVar2 != (engr *)0x0) {
    do {
      if ((peVar2->engr_lth != 0) && (*peVar2->engr_txt != '\0')) {
        xVar1 = ledger_no(&lev->z);
        mtag(mf,(long)peVar2->engr_y * 0x10000 + (long)xVar1 + (long)peVar2->engr_x * 0x100,
             MTAG_ENGRAVING);
        mwrite32(mf,peVar2->engr_lth);
        mwrite8(mf,peVar2->engr_x);
        mwrite8(mf,peVar2->engr_y);
        mwrite8(mf,peVar2->engr_type);
        mwrite(mf,peVar2 + 1,peVar2->engr_lth);
      }
      peVar2 = peVar2->nxt_engr;
    } while (peVar2 != (engr *)0x0);
  }
  mwrite32(mf,0);
  return;
}

Assistant:

void save_engravings(struct memfile *mf, struct level *lev)
{
	struct engr *ep;
	char *txtbase; /* ep->engr_txt may have been incremented */

	mfmagic_set(mf, ENGRAVE_MAGIC);
	
	for (ep = lev->lev_engr; ep; ep = ep->nxt_engr) {
	    if (ep->engr_lth && ep->engr_txt[0]) {
		/* To distinguish engravings from each other in tags,
		 * we use x/y/z coords. */
		mtag(mf, ledger_no(&lev->z) + ((int)ep->engr_x << 8) +
		     ((int)ep->engr_y << 16), MTAG_ENGRAVING);
		mwrite32(mf, ep->engr_lth);
		mwrite8(mf, ep->engr_x);
		mwrite8(mf, ep->engr_y);
		mwrite8(mf, ep->engr_type);
		txtbase = (char *)(ep + 1);
		mwrite(mf, txtbase, ep->engr_lth);
	    }
	}
	mwrite32(mf, 0); /* no more engravings */
}